

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindFileContainingExtension
          (EncodedDescriptorDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  bool bVar1;
  pointer this_00;
  pair<const_void_*,_int> pVar2;
  pair<const_void_*,_int> encoded_file;
  StringPiece local_48;
  void *local_38;
  int local_30;
  FileDescriptorProto *local_28;
  FileDescriptorProto *output_local;
  string *psStack_18;
  int field_number_local;
  string *containing_type_local;
  EncodedDescriptorDatabase *this_local;
  
  local_28 = output;
  output_local._4_4_ = field_number;
  psStack_18 = containing_type;
  containing_type_local = (string *)this;
  this_00 = std::
            unique_ptr<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
            ::operator->(&this->index_);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_48,psStack_18);
  pVar2 = DescriptorIndex::FindExtension(this_00,local_48,output_local._4_4_);
  local_38 = pVar2.first;
  local_30 = pVar2.second;
  encoded_file._12_4_ = 0;
  encoded_file.first = (void *)SUB128(pVar2._0_12_,0);
  encoded_file.second = SUB124(pVar2._0_12_,8);
  bVar1 = MaybeParse(this,encoded_file,local_28);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::FindFileContainingExtension(
    const std::string& containing_type, int field_number,
    FileDescriptorProto* output) {
  return MaybeParse(index_->FindExtension(containing_type, field_number),
                    output);
}